

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS ref_metric_inspect(REF_NODE ref_node)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL m [6];
  int local_1c;
  REF_INT node;
  REF_NODE ref_node_local;
  
  local_1c = 0;
  do {
    if (ref_node->max <= local_1c) {
      return 0;
    }
    if (((-1 < local_1c) && (local_1c < ref_node->max)) && (-1 < ref_node->global[local_1c])) {
      uVar1 = ref_node_metric_get(ref_node,local_1c,(REF_DBL *)&ref_private_macro_code_rss_1);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x36,"ref_metric_inspect",(ulong)uVar1,"get");
        return uVar1;
      }
      uVar1 = ref_metric_show((REF_DBL *)&ref_private_macro_code_rss_1);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x37,"ref_metric_inspect",(ulong)uVar1,"show it");
        return uVar1;
      }
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_metric_inspect(REF_NODE ref_node) {
  REF_INT node;
  REF_DBL m[6];
  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_node_metric_get(ref_node, node, m), "get");
    RSS(ref_metric_show(m), "show it");
  }
  return REF_SUCCESS;
}